

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelwriter.h
# Opt level: O0

Layer * __thiscall ModelWriter::create_custom_layer(ModelWriter *this,char *type)

{
  Net *in_RSI;
  long in_RDI;
  Layer *layer;
  void *in_stack_00000028;
  layer_destroyer_func in_stack_00000030;
  layer_creator_func in_stack_00000038;
  char *in_stack_00000040;
  Net *in_stack_00000048;
  char *in_stack_ffffffffffffffe0;
  Layer *local_8;
  
  local_8 = ncnn::Net::create_custom_layer(in_RSI,in_stack_ffffffffffffffe0);
  if (local_8 == (Layer *)0x0) {
    fprintf(_stderr,"create_custom_layer %s\n",in_RSI);
    ncnn::Net::register_custom_layer
              (in_stack_00000048,in_stack_00000040,in_stack_00000038,in_stack_00000030,
               in_stack_00000028);
    *(undefined1 *)(in_RDI + 0x60) = 1;
    local_8 = ncnn::Net::create_custom_layer(in_RSI,(char *)local_8);
  }
  return local_8;
}

Assistant:

ncnn::Layer* ModelWriter::create_custom_layer(const char* type)
{
    ncnn::Layer* layer = Net::create_custom_layer(type);
    if (layer)
        return layer;

    fprintf(stderr, "create_custom_layer %s\n", type);

    register_custom_layer(type, CustomLayer_layer_creator);

    has_custom_layer = true;

    return Net::create_custom_layer(type);
}